

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

AWeapon * __thiscall APlayerPawn::BestWeapon(APlayerPawn *this,PClassAmmo *ammotype)

{
  bool bVar1;
  AInventory *pAVar2;
  AAmmo *pAVar3;
  MetaClass *pMVar4;
  AWeapon *pAVar5;
  bool tomed;
  AWeapon *weap;
  AInventory *item;
  AWeapon *pAStack_20;
  int bestOrder;
  AWeapon *bestMatch;
  PClassAmmo *ammotype_local;
  APlayerPawn *this_local;
  
  pAStack_20 = (AWeapon *)0x0;
  item._4_4_ = 0x7fffffff;
  pAVar2 = AActor::FindInventory
                     (&this->super_AActor,
                      (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
  weap = (AWeapon *)
         ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&(this->super_AActor).Inventory);
  do {
    if (weap == (AWeapon *)0x0) {
      return pAStack_20;
    }
    bVar1 = DObject::IsKindOf((DObject *)weap,AWeapon::RegistrationInfo.MyClass);
    if ((bVar1) && (weap->SelectionOrder <= item._4_4_)) {
      if (ammotype == (PClassAmmo *)0x0) {
LAB_0061cf54:
        if (((((((pAVar2 == (AInventory *)0x0) ||
                (bVar1 = TObjPtr<AWeapon>::operator!=(&weap->SisterWeapon,(AWeapon *)0x0), !bVar1))
               || (pAVar5 = TObjPtr<AWeapon>::operator->(&weap->SisterWeapon),
                  (*(uint *)&(pAVar5->super_AStateProvider).super_AInventory.field_0x4fc & 0x400) ==
                  0)) &&
              ((pAVar2 != (AInventory *)0x0 ||
               ((*(uint *)&(weap->super_AStateProvider).super_AInventory.field_0x4fc & 0x400) == 0))
              )) && (((*(uint *)&(weap->super_AStateProvider).super_AInventory.field_0x4fc & 0x20)
                      != 0 || (bVar1 = AWeapon::CheckAmmo(weap,0,false,false,-1), bVar1)))) &&
            ((weap->MinSelAmmo1 < 1 ||
             ((bVar1 = TObjPtr<AAmmo>::operator==(&weap->Ammo1,(AAmmo *)0x0), !bVar1 &&
              (pAVar3 = TObjPtr<AAmmo>::operator->(&weap->Ammo1),
              weap->MinSelAmmo1 <= (pAVar3->super_AInventory).Amount)))))) &&
           ((weap->MinSelAmmo2 < 1 ||
            ((bVar1 = TObjPtr<AAmmo>::operator==(&weap->Ammo2,(AAmmo *)0x0), !bVar1 &&
             (pAVar3 = TObjPtr<AAmmo>::operator->(&weap->Ammo2),
             weap->MinSelAmmo2 <= (pAVar3->super_AInventory).Amount)))))) {
          item._4_4_ = weap->SelectionOrder;
          pAStack_20 = weap;
        }
      }
      else {
        bVar1 = TObjPtr<AAmmo>::operator==(&weap->Ammo1,(AAmmo *)0x0);
        if (!bVar1) {
          pAVar3 = TObjPtr<AAmmo>::operator->(&weap->Ammo1);
          pMVar4 = AAmmo::GetClass(pAVar3);
          if (pMVar4 == ammotype) goto LAB_0061cf54;
        }
      }
    }
    weap = (AWeapon *)
           ::TObjPtr::operator_cast_to_AInventory_
                     ((TObjPtr *)
                      &(weap->super_AStateProvider).super_AInventory.super_AActor.Inventory);
  } while( true );
}

Assistant:

AWeapon *APlayerPawn::BestWeapon(PClassAmmo *ammotype)
{
	AWeapon *bestMatch = NULL;
	int bestOrder = INT_MAX;
	AInventory *item;
	AWeapon *weap;
	bool tomed = NULL != FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true);

	// Find the best weapon the player has.
	for (item = Inventory; item != NULL; item = item->Inventory)
	{
		if (!item->IsKindOf (RUNTIME_CLASS(AWeapon)))
			continue;

		weap = static_cast<AWeapon *> (item);

		// Don't select it if it's worse than what was already found.
		if (weap->SelectionOrder > bestOrder)
			continue;

		// Don't select it if its primary fire doesn't use the desired ammo.
		if (ammotype != NULL &&
			(weap->Ammo1 == NULL ||
			 weap->Ammo1->GetClass() != ammotype))
			continue;

		// Don't select it if the Tome is active and this isn't the powered-up version.
		if (tomed && weap->SisterWeapon != NULL && weap->SisterWeapon->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if it's powered-up and the Tome is not active.
		if (!tomed && weap->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if there isn't enough ammo to use its primary fire.
		if (!(weap->WeaponFlags & WIF_AMMO_OPTIONAL) &&
			!weap->CheckAmmo (AWeapon::PrimaryFire, false))
			continue;

		// Don't select if if there isn't enough ammo as determined by the weapon's author.
		if (weap->MinSelAmmo1 > 0 && (weap->Ammo1 == NULL || weap->Ammo1->Amount < weap->MinSelAmmo1))
			continue;
		if (weap->MinSelAmmo2 > 0 && (weap->Ammo2 == NULL || weap->Ammo2->Amount < weap->MinSelAmmo2))
			continue;

		// This weapon is usable!
		bestOrder = weap->SelectionOrder;
		bestMatch = weap;
	}
	return bestMatch;
}